

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void blend_a64_mask_sy_w32n_avx2
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  __m256i v;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  uint8_t *in_RSI;
  uint8_t *in_R8;
  uint in_R9D;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar7;
  void *a;
  undefined1 auVar8 [16];
  undefined1 auVar5 [16];
  undefined8 uVar9;
  undefined1 auVar6 [32];
  long in_stack_00000008;
  __m256i v_m1_b;
  __m256i v_m0_b;
  __m256i v_rb_b;
  __m256i v_ra_b;
  int c;
  __m256i v_maxval_b;
  undefined1 in_stack_fffffffffffffdc0 [24];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_208;
  int local_164;
  undefined1 auVar10 [16];
  __m256i *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  
  auVar4 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar4 = vpinsrb_avx(auVar4,0x40,2);
  auVar4 = vpinsrb_avx(auVar4,0x40,3);
  auVar4 = vpinsrb_avx(auVar4,0x40,4);
  auVar4 = vpinsrb_avx(auVar4,0x40,5);
  auVar4 = vpinsrb_avx(auVar4,0x40,6);
  auVar4 = vpinsrb_avx(auVar4,0x40,7);
  auVar4 = vpinsrb_avx(auVar4,0x40,8);
  auVar4 = vpinsrb_avx(auVar4,0x40,9);
  auVar4 = vpinsrb_avx(auVar4,0x40,10);
  auVar4 = vpinsrb_avx(auVar4,0x40,0xb);
  auVar4 = vpinsrb_avx(auVar4,0x40,0xc);
  auVar4 = vpinsrb_avx(auVar4,0x40,0xd);
  auVar4 = vpinsrb_avx(auVar4,0x40,0xe);
  auVar4 = vpinsrb_avx(auVar4,0x40,0xf);
  auVar8 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar8 = vpinsrb_avx(auVar8,0x40,2);
  auVar8 = vpinsrb_avx(auVar8,0x40,3);
  auVar8 = vpinsrb_avx(auVar8,0x40,4);
  auVar8 = vpinsrb_avx(auVar8,0x40,5);
  auVar8 = vpinsrb_avx(auVar8,0x40,6);
  auVar8 = vpinsrb_avx(auVar8,0x40,7);
  auVar8 = vpinsrb_avx(auVar8,0x40,8);
  auVar8 = vpinsrb_avx(auVar8,0x40,9);
  auVar8 = vpinsrb_avx(auVar8,0x40,10);
  auVar8 = vpinsrb_avx(auVar8,0x40,0xb);
  auVar8 = vpinsrb_avx(auVar8,0x40,0xc);
  auVar8 = vpinsrb_avx(auVar8,0x40,0xd);
  auVar8 = vpinsrb_avx(auVar8,0x40,0xe);
  auVar8 = vpinsrb_avx(auVar8,0x40,0xf);
  auVar3 = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar8;
  auVar8 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
  auVar4 = auVar3;
  auVar10 = auVar8;
  do {
    for (local_164 = 0; local_164 < (int)mask_stride; local_164 = local_164 + 0x20) {
      yy_loadu_256((__m256i *)(in_stack_00000008 + local_164),in_RSI);
      uVar9 = auVar8._8_8_;
      uVar7 = auVar8._0_8_;
      auVar5 = auVar4;
      yy_loadu_256((__m256i *)(in_stack_00000008 + local_164 + ((ulong)mask & 0xffffffff)),in_RSI);
      auVar1._16_8_ = uVar7;
      auVar1._0_16_ = auVar4;
      auVar1._24_8_ = uVar9;
      auVar6._16_8_ = auVar8._0_8_;
      auVar6._0_16_ = auVar5;
      auVar6._24_8_ = auVar8._8_8_;
      auVar6 = vpavgb_avx2(auVar1,auVar6);
      auVar2._16_8_ = auVar10._0_8_;
      auVar2._0_16_ = auVar3;
      auVar2._24_8_ = auVar10._8_8_;
      auVar6 = vpsubb_avx2(auVar2,auVar6);
      in_RSI = in_R8 + local_164;
      blend_32_u8_avx2(in_R8,(uint8_t *)CONCAT44(in_R9D,in_stack_fffffffffffffec8),
                       in_stack_fffffffffffffec0,auVar10._8_8_,auVar10._4_4_);
      local_220 = auVar6._0_8_;
      uStack_218 = auVar6._8_8_;
      a = auVar6._16_8_;
      uStack_208 = auVar6._24_8_;
      v[1] = in_stack_fffffffffffffdc0._0_8_;
      v[2] = in_stack_fffffffffffffdc0._8_8_;
      v[3] = in_stack_fffffffffffffdc0._16_8_;
      v[0] = 0x5e53d5;
      yy_storeu_256(a,v);
      auVar8._8_8_ = uStack_208;
      auVar8._0_8_ = a;
      auVar4._8_8_ = uStack_218;
      auVar4._0_8_ = local_220;
    }
    in_R8 = in_R8 + in_R9D;
    in_stack_00000008 = in_stack_00000008 + (ulong)(uint)((int)mask << 1);
    w = w + -1;
  } while (w != 0);
  return;
}

Assistant:

static inline void blend_a64_mask_sy_w32n_avx2(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  const __m256i v_maxval_b = _mm256_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  do {
    int c;
    for (c = 0; c < w; c += 32) {
      const __m256i v_ra_b = yy_loadu_256(mask + c);
      const __m256i v_rb_b = yy_loadu_256(mask + c + mask_stride);
      const __m256i v_m0_b = _mm256_avg_epu8(v_ra_b, v_rb_b);
      const __m256i v_m1_b = _mm256_sub_epi8(v_maxval_b, v_m0_b);
      const __m256i v_res_b = blend_32_u8_avx2(
          src0 + c, src1 + c, &v_m0_b, &v_m1_b, AOM_BLEND_A64_ROUND_BITS);

      yy_storeu_256(dst + c, v_res_b);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 2 * mask_stride;
  } while (--h);
}